

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzRead(int *bzerror,BZFILE *b,void *buf,int len)

{
  Bool BVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  char *in_RDX;
  FILE *in_RSI;
  int *in_RDI;
  bzFile *bzf;
  Int32 ret;
  Int32 n;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI != (int *)0x0) {
    *in_RDI = 0;
  }
  if (((in_RSI == (FILE *)0x0) ||
      (in_RSI[0x17]._cur_column = 0, in_RSI[0x17]._vtable_offset = '\0',
      in_RSI[0x17]._shortbuf[0] = '\0', in_RDX == (char *)0x0)) || (in_ECX < 0)) {
    if (in_RDI != (int *)0x0) {
      *in_RDI = -2;
    }
    if (in_RSI != (FILE *)0x0) {
      in_RSI[0x17]._cur_column = 0xfffe;
      in_RSI[0x17]._vtable_offset = -1;
      in_RSI[0x17]._shortbuf[0] = -1;
    }
    local_4 = 0;
  }
  else if (*(char *)((long)&in_RSI[0x17]._IO_write_ptr + 4) == '\0') {
    if (in_ECX == 0) {
      if (in_RDI != (int *)0x0) {
        *in_RDI = 0;
      }
      if (in_RSI != (FILE *)0x0) {
        in_RSI[0x17]._cur_column = 0;
        in_RSI[0x17]._vtable_offset = '\0';
        in_RSI[0x17]._shortbuf[0] = '\0';
      }
      local_4 = 0;
    }
    else {
      *(int *)&in_RSI[0x17]._IO_backup_base = in_ECX;
      in_RSI[0x17]._IO_save_base = in_RDX;
      do {
        iVar2 = ferror(*(FILE **)in_RSI);
        if (iVar2 != 0) {
          if (in_RDI != (int *)0x0) {
            *in_RDI = -6;
          }
          if (in_RSI != (FILE *)0x0) {
            in_RSI[0x17]._cur_column = 0xfffa;
            in_RSI[0x17]._vtable_offset = -1;
            in_RSI[0x17]._shortbuf[0] = -1;
          }
          return 0;
        }
        if ((*(int *)&in_RSI[0x17]._IO_buf_base == 0) && (BVar1 = myfeof(in_RSI), BVar1 == '\0')) {
          sVar3 = fread(&in_RSI->_IO_read_ptr,1,5000,*(FILE **)in_RSI);
          in_stack_ffffffffffffffd8 = (undefined4)sVar3;
          iVar2 = ferror(*(FILE **)in_RSI);
          if (iVar2 != 0) {
            if (in_RDI != (int *)0x0) {
              *in_RDI = -6;
            }
            if (in_RSI != (FILE *)0x0) {
              in_RSI[0x17]._cur_column = 0xfffa;
              in_RSI[0x17]._vtable_offset = -1;
              in_RSI[0x17]._shortbuf[0] = -1;
            }
            return 0;
          }
          *(undefined4 *)&in_RSI[0x17]._IO_write_ptr = in_stack_ffffffffffffffd8;
          *(undefined4 *)&in_RSI[0x17]._IO_buf_base = *(undefined4 *)&in_RSI[0x17]._IO_write_ptr;
          in_RSI[0x17]._IO_write_end = (char *)&in_RSI->_IO_read_ptr;
        }
        iVar2 = BZ2_bzDecompress((bz_stream *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
        if ((iVar2 != 0) && (iVar2 != 4)) {
          if (in_RDI != (int *)0x0) {
            *in_RDI = iVar2;
          }
          if (in_RSI != (FILE *)0x0) {
            in_RSI[0x17]._cur_column = (short)iVar2;
            in_RSI[0x17]._vtable_offset = (char)((uint)iVar2 >> 0x10);
            in_RSI[0x17]._shortbuf[0] = (char)((uint)iVar2 >> 0x18);
          }
          return 0;
        }
        if ((((iVar2 == 0) && (BVar1 = myfeof(in_RSI), BVar1 != '\0')) &&
            (*(int *)&in_RSI[0x17]._IO_buf_base == 0)) &&
           (*(int *)&in_RSI[0x17]._IO_backup_base != 0)) {
          if (in_RDI != (int *)0x0) {
            *in_RDI = -7;
          }
          if (in_RSI != (FILE *)0x0) {
            in_RSI[0x17]._cur_column = 0xfff9;
            in_RSI[0x17]._vtable_offset = -1;
            in_RSI[0x17]._shortbuf[0] = -1;
          }
          return 0;
        }
        if (iVar2 == 4) {
          if (in_RDI != (int *)0x0) {
            *in_RDI = 4;
          }
          if (in_RSI != (FILE *)0x0) {
            in_RSI[0x17]._cur_column = 4;
            in_RSI[0x17]._vtable_offset = '\0';
            in_RSI[0x17]._shortbuf[0] = '\0';
          }
          return in_ECX - *(int *)&in_RSI[0x17]._IO_backup_base;
        }
      } while (*(int *)&in_RSI[0x17]._IO_backup_base != 0);
      if (in_RDI != (int *)0x0) {
        *in_RDI = 0;
      }
      local_4 = in_ECX;
      if (in_RSI != (FILE *)0x0) {
        in_RSI[0x17]._cur_column = 0;
        in_RSI[0x17]._vtable_offset = '\0';
        in_RSI[0x17]._shortbuf[0] = '\0';
      }
    }
  }
  else {
    if (in_RDI != (int *)0x0) {
      *in_RDI = -1;
    }
    if (in_RSI != (FILE *)0x0) {
      in_RSI[0x17]._cur_column = 0xffff;
      in_RSI[0x17]._vtable_offset = -1;
      in_RSI[0x17]._shortbuf[0] = -1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BZ_API(BZ2_bzRead)
           ( int*    bzerror,
             BZFILE* b,
             void*   buf,
             int     len )
{
   Int32   n, ret;
   bzFile* bzf = (bzFile*)b;

   BZ_SETERR(BZ_OK);

   if (bzf == NULL || buf == NULL || len < 0)
      { BZ_SETERR(BZ_PARAM_ERROR); return 0; };

   if (bzf->writing)
      { BZ_SETERR(BZ_SEQUENCE_ERROR); return 0; };

   if (len == 0)
      { BZ_SETERR(BZ_OK); return 0; };

   bzf->strm.avail_out = len;
   bzf->strm.next_out = buf;

   while (True) {

      if (ferror(bzf->handle))
         { BZ_SETERR(BZ_IO_ERROR); return 0; };

      if (bzf->strm.avail_in == 0 && !myfeof(bzf->handle)) {
         n = fread ( bzf->buf, sizeof(UChar),
                     BZ_MAX_UNUSED, bzf->handle );
         if (ferror(bzf->handle))
            { BZ_SETERR(BZ_IO_ERROR); return 0; };
         bzf->bufN = n;
         bzf->strm.avail_in = bzf->bufN;
         bzf->strm.next_in = bzf->buf;
      }

      ret = BZ2_bzDecompress ( &(bzf->strm) );

      if (ret != BZ_OK && ret != BZ_STREAM_END)
         { BZ_SETERR(ret); return 0; };

      if (ret == BZ_OK && myfeof(bzf->handle) &&
          bzf->strm.avail_in == 0 && bzf->strm.avail_out > 0)
         { BZ_SETERR(BZ_UNEXPECTED_EOF); return 0; };

      if (ret == BZ_STREAM_END)
         { BZ_SETERR(BZ_STREAM_END);
           return len - bzf->strm.avail_out; };
      if (bzf->strm.avail_out == 0)
         { BZ_SETERR(BZ_OK); return len; };

   }

   return 0; /*not reached*/
}